

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

void __thiscall FSerializer::Close(FSerializer *this)

{
  FWriter *this_00;
  DObject **ppDVar1;
  DThinker *pDVar2;
  long lVar3;
  FReader *this_01;
  ulong uVar4;
  
  this_00 = this->w;
  if (this_00 != (FWriter *)0x0) {
    FWriter::~FWriter(this_00);
    operator_delete(this_00,0x78);
    this->w = (FWriter *)0x0;
  }
  this_01 = this->r;
  if (this_01 == (FReader *)0x0) goto LAB_00478144;
  uVar4 = (ulong)(this_01->mDObjects).Count;
  if (uVar4 == 0) {
LAB_00478110:
    TArray<DObject_*,_DObject_*>::~TArray(&this_01->mDObjects);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument(&this_01->mDoc);
    TArray<FJSONObject,_FJSONObject>::~TArray(&this_01->mObjects);
  }
  else {
    ppDVar1 = (this_01->mDObjects).Array;
    lVar3 = 0;
    do {
      pDVar2 = dyn_cast<DThinker>(*(DObject **)((long)ppDVar1 + lVar3));
      if ((pDVar2 != (DThinker *)0x0) &&
         ((pDVar2->NextThinker == (DThinker *)0x0 || (pDVar2->PrevThinker == (DThinker *)0x0)))) {
        (*(pDVar2->super_DObject)._vptr_DObject[4])(pDVar2);
      }
      lVar3 = lVar3 + 8;
    } while (uVar4 << 3 != lVar3);
    this_01 = this->r;
    if (this_01 != (FReader *)0x0) goto LAB_00478110;
    this_01 = (FReader *)0x0;
  }
  operator_delete(this_01,0xb8);
  this->r = (FReader *)0x0;
LAB_00478144:
  if (0 < this->mErrors) {
    I_Error("%d errors parsing JSON");
    return;
  }
  return;
}

Assistant:

void FSerializer::Close()
{	
	if (w != nullptr)
	{
		delete w;
		w = nullptr;
	}
	if (r != nullptr)
	{
		// we must explicitly delete all thinkers in the array which did not get linked into the thinker lists.
		// Otherwise these objects may survive a level deletion and point to incorrect data.
		for (auto &obj : r->mDObjects)
		{
			auto think = dyn_cast<DThinker>(obj);
			if (think != nullptr)
			{
				if (think->NextThinker == nullptr || think->PrevThinker == nullptr)
				{
					think->Destroy();
				}
			}
		}

		delete r;
		r = nullptr;
	}
	if (mErrors > 0)
	{
		I_Error("%d errors parsing JSON", mErrors);
	}
}